

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O2

void Fra_ManClean(Fra_Man_t *p,int nNodesMax)

{
  size_t __size;
  Vec_Ptr_t **__ptr;
  int *piVar1;
  int i;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  while( true ) {
    lVar3 = (long)p->nMemAlloc;
    if (lVar3 <= lVar2) break;
    if ((Vec_Ptr_t *)0x1 < p->pMemFanins[lVar2]) {
      Vec_PtrFree(p->pMemFanins[lVar2]);
    }
    lVar2 = lVar2 + 1;
  }
  __ptr = p->pMemFanins;
  if (p->nMemAlloc < nNodesMax) {
    __size = (long)nNodesMax * 8 + 40000;
    if (__ptr == (Vec_Ptr_t **)0x0) {
      __ptr = (Vec_Ptr_t **)malloc(__size);
    }
    else {
      __ptr = (Vec_Ptr_t **)realloc(__ptr,__size);
    }
    p->pMemFanins = __ptr;
    lVar3 = (long)(nNodesMax + 5000);
    if (p->pMemSatNums == (int *)0x0) {
      piVar1 = (int *)malloc(lVar3 * 4);
    }
    else {
      piVar1 = (int *)realloc(p->pMemSatNums,lVar3 * 4);
      __ptr = p->pMemFanins;
    }
    p->pMemSatNums = piVar1;
    p->nMemAlloc = nNodesMax + 5000;
  }
  memset(__ptr,0,lVar3 << 3);
  memset(p->pMemSatNums,0,(long)p->nMemAlloc << 2);
  return;
}

Assistant:

void Fra_ManClean( Fra_Man_t * p, int nNodesMax )
{
    int i;
    // remove old arrays
    for ( i = 0; i < p->nMemAlloc; i++ )
        if ( p->pMemFanins[i] && p->pMemFanins[i] != (void *)1 )
            Vec_PtrFree( p->pMemFanins[i] );
    // realloc for the new size
    if ( p->nMemAlloc < nNodesMax )
    {
        int nMemAllocNew = nNodesMax + 5000;
        p->pMemFanins = ABC_REALLOC( Vec_Ptr_t *, p->pMemFanins, nMemAllocNew );
        p->pMemSatNums = ABC_REALLOC( int, p->pMemSatNums, nMemAllocNew );
        p->nMemAlloc = nMemAllocNew;
    }
    // prepare for the new run
    memset( p->pMemFanins, 0, sizeof(Vec_Ptr_t *) * p->nMemAlloc );
    memset( p->pMemSatNums, 0, sizeof(int) * p->nMemAlloc );
}